

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-trust-schema-pattern-component.c
# Opt level: O2

int ndn_trust_schema_pattern_component_copy
              (ndn_trust_schema_pattern_component_t *lhs,ndn_trust_schema_pattern_component_t *rhs)

{
  int iVar1;
  
  rhs->type = lhs->type;
  iVar1 = -0xa3;
  if ((ulong)lhs->size < 0x33) {
    memcpy(rhs->value,lhs->value,(ulong)lhs->size);
    rhs->subpattern_info = lhs->subpattern_info;
    rhs->size = lhs->size;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
ndn_trust_schema_pattern_component_copy(const ndn_trust_schema_pattern_component_t *lhs, ndn_trust_schema_pattern_component_t *rhs)
{
  rhs->type = lhs->type;
  if (lhs->size > NDN_TRUST_SCHEMA_PATTERN_COMPONENT_BUFFER_SIZE)
    return NDN_TRUST_SCHEMA_PATTERN_COMPONENT_INVALID_SIZE;
  memcpy(rhs->value, lhs->value, lhs->size);
  rhs->subpattern_info = lhs->subpattern_info;
  rhs->size = lhs->size;

  return 0;
}